

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTcPrsOpBin::parse(CTcPrsOpBin *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *pCVar4;
  CTcPrsNode *pCVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (**this->left_->_vptr_CTcPrsOp)();
  pCVar2 = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  if (pCVar2 == (CTcPrsNode *)0x0) {
LAB_0022a4cb:
    pCVar2 = (CTcPrsNode *)0x0;
  }
  else {
    pCVar4 = pCVar2;
    if ((G_tok->curtok_).typ_ == this->op_tok_) {
      do {
        CTcTokenizer::next(G_tok);
        iVar1 = (**this->right_->_vptr_CTcPrsOp)();
        lVar3 = CONCAT44(extraout_var_00,iVar1);
        if (lVar3 == 0) goto LAB_0022a4cb;
        iVar1 = (*(this->super_CTcPrsOp)._vptr_CTcPrsOp[2])(this,pCVar4,lVar3);
        pCVar2 = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar1);
        if (pCVar2 == (CTcPrsNode *)0x0) {
          iVar1 = (*(this->super_CTcPrsOp)._vptr_CTcPrsOp[1])(this,pCVar4,lVar3);
          pCVar2 = (CTcPrsNode *)CONCAT44(extraout_var_02,iVar1);
        }
        pCVar4 = pCVar2;
      } while ((G_tok->curtok_).typ_ == this->op_tok_);
    }
  }
  return pCVar2;
}

Assistant:

CTcPrsNode *CTcPrsOpBin::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find our operator */
    for (;;)
    {
        /* check my operator */
        if (G_tok->cur() == get_op_tok())
        {
            /* skip the matching token */
            G_tok->next();
            
            /* parse the right-hand side */
            CTcPrsNode *rhs = right_->parse();
            if (rhs == 0)
                return 0;

            /* try folding our subnodes into a constant value, if possible */
            CTcPrsNode *const_tree = eval_constant(lhs, rhs);

            /* 
             *   if we couldn't calculate a constant value, build the tree
             *   normally 
             */
            if (const_tree == 0)
            {
                /* 
                 *   Build my tree, then proceed to parse any additional
                 *   occurrences of our operator, with the result of
                 *   applying this occurrence of the operator as the
                 *   left-hand side of the new operator.  
                 */
                lhs = build_tree(lhs, rhs);
            }
            else
            {
                /* we got a constant value - use it as the result directly */
                lhs = const_tree;
            }
        }
        else
        {
            /* 
             *   it's not my operator - return what we thought might have
             *   been our left-hand side 
             */
            return lhs;
        }
    }
}